

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Stop_Freeze_PDU::Encode(Stop_Freeze_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Stop_Freeze_PDU *this_local;
  
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  pKVar1 = DATA_TYPE::operator<<(stream,&(this->m_RealWorldTime).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Reason);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8FrozenBehaviour);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding);
  KDataStream::operator<<(pKVar1,this->m_ui32RequestID);
  return;
}

Assistant:

void Stop_Freeze_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );
    stream << KDIS_STREAM m_RealWorldTime
           << m_ui8Reason
           << m_ui8FrozenBehaviour
           << m_ui16Padding
           << m_ui32RequestID;
}